

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_solver.c
# Opt level: O0

termination_code
PDHG_Check_Dual_Infeasibility
          (CUPDLPwork *pdhg,cupdlp_float dDualInfeasObj,cupdlp_float dDualInfeasRes)

{
  termination_code dualCode;
  CUPDLPresobj *resobj;
  cupdlp_float dDualInfeasRes_local;
  cupdlp_float dDualInfeasObj_local;
  CUPDLPwork *pdhg_local;
  
  dualCode = FEASIBLE;
  if ((dDualInfeasObj < 0.0) && (dDualInfeasRes < -pdhg->resobj->dFeasTol * dDualInfeasObj)) {
    dualCode = INFEASIBLE;
  }
  return dualCode;
}

Assistant:

termination_code PDHG_Check_Dual_Infeasibility(CUPDLPwork *pdhg,
                                               cupdlp_float dDualInfeasObj,
                                               cupdlp_float dDualInfeasRes) {
  CUPDLPresobj *resobj = pdhg->resobj;

  termination_code dualCode = FEASIBLE;

  if (dDualInfeasObj < 0.0) {
    if (dDualInfeasRes < -resobj->dFeasTol * dDualInfeasObj)
      dualCode = INFEASIBLE;
  }

  return dualCode;
}